

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void Id_DsdManTuneStr(If_DsdMan_t *p,char *pStruct,int nConfls,int nProcs,int fVerbose)

{
  bool bVar1;
  bool bVar2;
  FILE *pFile;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  abctime aVar7;
  Ifn_Ntk_t *pIVar8;
  char *pcVar9;
  void *pvVar10;
  Vec_Wrd_t *pVVar11;
  ProgressBar *p_00;
  word *__dest;
  If_DsdObj_t *pObj_00;
  abctime aVar12;
  abctime aVar13;
  word *pTtWords;
  int iCurrentObj;
  int fRunning;
  int status;
  abctime clkUsed;
  abctime clk_1;
  Ifn_ThData_t ThData [100];
  pthread_t WorkerThread [100];
  If_DsdObj_t *pObj;
  Ifn_Ntk_t *pNtk;
  abctime clk;
  int LutSize;
  int nVars;
  int k;
  int i;
  ProgressBar *pProgress;
  int fVeryVerbose;
  int fVerbose_local;
  int nProcs_local;
  int nConfls_local;
  char *pStruct_local;
  If_DsdMan_t *p_local;
  
  aVar7 = Abc_Clock();
  if (nProcs == 1) {
    Id_DsdManTuneStr1(p,pStruct,nConfls,fVerbose);
  }
  else if (nProcs < 0x65) {
    pIVar8 = Ifn_NtkParse(pStruct);
    if (pIVar8 != (Ifn_Ntk_t *)0x0) {
      iVar3 = If_DsdManVarNum(p);
      iVar4 = Ifn_NtkInputNum(pIVar8);
      if (iVar4 < iVar3) {
        uVar5 = If_DsdManVarNum(p);
        uVar6 = Ifn_NtkInputNum(pIVar8);
        printf("The support of DSD manager (%d) exceeds the support of the structure (%d).\n",
               (ulong)uVar5,(ulong)uVar6);
        if (pIVar8 != (Ifn_Ntk_t *)0x0) {
          free(pIVar8);
        }
      }
      else {
        if (p->pCellStr != (char *)0x0) {
          free(p->pCellStr);
          p->pCellStr = (char *)0x0;
        }
        pcVar9 = Abc_UtilStrsav(pStruct);
        p->pCellStr = pcVar9;
        iVar3 = If_DsdManVarNum(p);
        iVar4 = Ifn_NtkInputNum(pIVar8);
        if (iVar3 < iVar4) {
          uVar5 = If_DsdManVarNum(p);
          uVar6 = Ifn_NtkInputNum(pIVar8);
          printf("Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n"
                 ,(ulong)uVar5,(ulong)uVar6);
        }
        uVar5 = Ifn_NtkLutSizeMax(pIVar8);
        iVar3 = Ifn_NtkTtBits(pStruct);
        p->nTtBits = iVar3;
        iVar3 = Abc_Bit6WordNum(p->nTtBits);
        p->nConfigWords = iVar3 + 1;
        if (10 < p->nConfigWords) {
          __assert_fail("p->nConfigWords <= 10",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                        ,0xa4f,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
        }
        if (fVerbose != 0) {
          printf("Considering programmable cell: ");
          Ifn_NtkPrint(pIVar8);
          printf("Largest LUT size = %d.\n",(ulong)uVar5);
        }
        if (pIVar8 != (Ifn_Ntk_t *)0x0) {
          free(pIVar8);
        }
        if (0 < p->nObjsPrev) {
          uVar5 = p->nObjsPrev;
          uVar6 = Vec_PtrSize(&p->vObjs);
          printf("Starting the tuning process from object %d (out of %d).\n",(ulong)uVar5,
                 (ulong)uVar6);
        }
        for (nVars = 0; iVar3 = Vec_PtrSize(&p->vObjs), nVars < iVar3; nVars = nVars + 1) {
          pvVar10 = Vec_PtrEntry(&p->vObjs,nVars);
          if (p->nObjsPrev <= nVars) {
            *(uint *)((long)pvVar10 + 4) = *(uint *)((long)pvVar10 + 4) & 0xfffffeff;
          }
        }
        if (p->vConfigs == (Vec_Wrd_t *)0x0) {
          iVar3 = p->nConfigWords;
          iVar4 = Vec_PtrSize(&p->vObjs);
          pVVar11 = Vec_WrdStart(iVar3 * iVar4);
          p->vConfigs = pVVar11;
        }
        else {
          pVVar11 = p->vConfigs;
          iVar3 = p->nConfigWords;
          iVar4 = Vec_PtrSize(&p->vObjs);
          Vec_WrdFillExtra(pVVar11,iVar3 * iVar4,0);
        }
        pFile = _stdout;
        iVar3 = Vec_PtrSize(&p->vObjs);
        p_00 = Extra_ProgressBarStart(pFile,iVar3);
        _fRunning = 0;
        bVar2 = true;
        pTtWords._4_4_ = p->nObjsPrev;
        for (nVars = 0; nVars < nProcs; nVars = nVars + 1) {
          pIVar8 = Ifn_NtkParse(pStruct);
          ThData[(long)nVars + -1].clkUsed = (abctime)pIVar8;
          *(undefined4 *)((long)ThData[nVars].pConfig + 0x4c) = 0xffffffff;
          ThData[nVars].nConfigWords = -1;
          ThData[nVars].nVars = nConfls;
          ThData[nVars].Id = -1;
          ThData[nVars].nConfls = 0;
          ThData[nVars].Result = 0;
          ThData[nVars].Status = 0;
          *(int *)(ThData[nVars].pConfig + 9) = p->nConfigWords;
          iVar3 = pthread_create(WorkerThread + (long)nVars + -1,(pthread_attr_t *)0x0,
                                 Ifn_WorkerThread,&ThData[(long)nVars + -1].clkUsed);
          if (iVar3 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                          ,0xa74,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
          }
        }
        while( true ) {
          bVar1 = true;
          if (!bVar2) {
            iVar3 = Vec_PtrSize(&p->vObjs);
            bVar1 = (int)pTtWords._4_4_ < iVar3;
          }
          if (!bVar1) break;
          for (nVars = 0; nVars < nProcs; nVars = nVars + 1) {
            if (ThData[nVars].nConfls == 0) {
              if (ThData[nVars].nConfls != 0) {
                __assert_fail("ThData[i].Status == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                              ,0xa7d,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
              }
              if (-1 < ThData[nVars].nConfigWords) {
                if ((ThData[nVars].Id != 0) && (ThData[nVars].Id != 1)) {
                  __assert_fail("ThData[i].Result == 0 || ThData[i].Result == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                                ,0xa81,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)"
                               );
                }
                if (ThData[nVars].Id == 0) {
                  If_DsdVecObjSetMark(&p->vObjs,ThData[nVars].nConfigWords);
                }
                else {
                  __dest = Vec_WrdEntryP(p->vConfigs,p->nConfigWords * ThData[nVars].nConfigWords);
                  memcpy(__dest,ThData[nVars].pTruth + 0x3f,(long)p->nConfigWords << 3);
                }
                ThData[nVars].nConfigWords = -1;
                ThData[nVars].Id = -1;
              }
              iVar3 = Vec_PtrSize(&p->vObjs);
              if ((int)pTtWords._4_4_ < iVar3) {
                if ((pTtWords._4_4_ & 0xff) == 0) {
                  Extra_ProgressBarUpdate(p_00,pTtWords._4_4_,(char *)0x0);
                }
                pObj_00 = If_DsdVecObj(&p->vObjs,pTtWords._4_4_);
                iVar3 = If_DsdObjSuppSize(pObj_00);
                aVar13 = Abc_Clock();
                iVar4 = Abc_Var2Lit(pTtWords._4_4_,0);
                If_DsdManComputeTruthPtr(p,iVar4,(uchar *)0x0,(word *)(ThData + nVars));
                aVar12 = Abc_Clock();
                _fRunning = (aVar12 - aVar13) + _fRunning;
                *(int *)((long)ThData[nVars].pConfig + 0x4c) = iVar3;
                ThData[nVars].nConfigWords = pTtWords._4_4_;
                ThData[nVars].Id = -1;
                ThData[nVars].nConfls = 1;
                pTtWords._4_4_ = pTtWords._4_4_ + 1;
              }
            }
          }
          bVar2 = false;
          for (nVars = 0; nVars < nProcs; nVars = nVars + 1) {
            if ((ThData[nVars].nConfls == 1) ||
               ((ThData[nVars].nConfls == 0 && (-1 < ThData[nVars].nConfigWords)))) {
              bVar2 = true;
            }
          }
        }
        for (nVars = 0; nVars < nProcs; nVars = nVars + 1) {
          if (ThData[nVars].nConfls != 0) {
            __assert_fail("ThData[i].Status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                          ,0xaa9,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
          }
          ThData[nVars].nConfigWords = -1;
          ThData[nVars].nConfls = 1;
          if (ThData[(long)nVars + -1].clkUsed != 0) {
            free((void *)ThData[(long)nVars + -1].clkUsed);
            ThData[(long)nVars + -1].clkUsed = 0;
          }
        }
        if (fVerbose != 0) {
          printf("Main     : ");
          Abc_PrintTime(1,"Time",_fRunning);
          for (nVars = 0; nVars < nProcs; nVars = nVars + 1) {
            printf("Thread %d : ",(ulong)(uint)nVars);
            aVar13._0_4_ = ThData[nVars].Result;
            aVar13._4_4_ = ThData[nVars].Status;
            Abc_PrintTime(1,"Time",aVar13);
          }
        }
        p->nObjsPrev = 0;
        p->LutSize = 0;
        Extra_ProgressBarStop(p_00);
        uVar5 = Vec_PtrSize(&p->vObjs);
        printf("Finished matching %d functions. ",(ulong)uVar5);
        aVar13 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar13 - aVar7);
      }
    }
  }
  else {
    printf("The number of processes (%d) exceeds the precompiled limit (%d).\n",(ulong)(uint)nProcs,
           100);
  }
  return;
}

Assistant:

void Id_DsdManTuneStr( If_DsdMan_t * p, char * pStruct, int nConfls, int nProcs, int fVerbose )
{
    int fVeryVerbose = 0;
    ProgressBar * pProgress = NULL;
    int i, k, nVars, LutSize;
    abctime clk = Abc_Clock();
    Ifn_Ntk_t * pNtk;
    If_DsdObj_t * pObj;
    if ( nProcs == 1 )
    {
        Id_DsdManTuneStr1( p, pStruct, nConfls, fVerbose );
        return;
    }
    if ( nProcs > PAR_THR_MAX )
    {
        printf( "The number of processes (%d) exceeds the precompiled limit (%d).\n", nProcs, PAR_THR_MAX );
        return;
    }
    // parse the structure
    pNtk = Ifn_NtkParse( pStruct );
    if ( pNtk == NULL )
        return;
    if ( If_DsdManVarNum(p) > Ifn_NtkInputNum(pNtk) )
    {
        printf( "The support of DSD manager (%d) exceeds the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
        ABC_FREE( pNtk );
        return;
    }
    ABC_FREE( p->pCellStr );
    p->pCellStr = Abc_UtilStrsav( pStruct );
    if ( If_DsdManVarNum(p) < Ifn_NtkInputNum(pNtk) )
        printf( "Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
    // check the largest LUT
    LutSize = Ifn_NtkLutSizeMax(pNtk);
    p->nTtBits = Ifn_NtkTtBits( pStruct );
    p->nConfigWords = 1 + Abc_Bit6WordNum( p->nTtBits );
    assert( p->nConfigWords <= 10 );
    if ( fVerbose )
    {
        printf( "Considering programmable cell: " );
        Ifn_NtkPrint( pNtk );
        printf( "Largest LUT size = %d.\n", LutSize );
    }
    ABC_FREE( pNtk );
    if ( p->nObjsPrev > 0 )
        printf( "Starting the tuning process from object %d (out of %d).\n", p->nObjsPrev, Vec_PtrSize(&p->vObjs) );
    // clean the attributes
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        if ( i >= p->nObjsPrev )
            pObj->fMark = 0;
    if ( p->vConfigs == NULL )
        p->vConfigs = Vec_WrdStart( p->nConfigWords * Vec_PtrSize(&p->vObjs) );
    else
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs), 0 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(&p->vObjs) );

    // perform concurrent solving
    {
        pthread_t WorkerThread[PAR_THR_MAX];
        Ifn_ThData_t ThData[PAR_THR_MAX];
        abctime clk, clkUsed = 0;
        int status, fRunning = 1, iCurrentObj = p->nObjsPrev;
        // start the threads
        for ( i = 0; i < nProcs; i++ )
        {
            ThData[i].pNtk     = Ifn_NtkParse( pStruct );
            ThData[i].nVars    = -1;      // support
            ThData[i].Id       = -1;      // object
            ThData[i].nConfls  = nConfls; // conflicts
            ThData[i].Result   = -1;      // result
            ThData[i].Status   =  0;      // state
            ThData[i].clkUsed  =  0;      // total runtime
            ThData[i].nConfigWords = p->nConfigWords;
            status = pthread_create( WorkerThread + i, NULL, Ifn_WorkerThread, (void *)(ThData + i) );  assert( status == 0 );
        }
        // run the threads
        while ( fRunning || iCurrentObj < Vec_PtrSize(&p->vObjs) )
        {
            for ( i = 0; i < nProcs; i++ )
            {
                if ( ThData[i].Status )
                    continue;
                assert( ThData[i].Status == 0 );
                if ( ThData[i].Id >= 0 )
                {
                    //printf( "Closing obj %d with Thread %d:\n", ThData[i].Id, i );
                    assert( ThData[i].Result == 0 || ThData[i].Result == 1 );
                    if ( ThData[i].Result == 0 )
                        If_DsdVecObjSetMark( &p->vObjs, ThData[i].Id );
                    else
                    {
                        word * pTtWords = Vec_WrdEntryP( p->vConfigs, p->nConfigWords * ThData[i].Id );
                        memcpy( pTtWords, ThData[i].pConfig, sizeof(word) * p->nConfigWords );
                    }
                    ThData[i].Id     = -1;
                    ThData[i].Result = -1;
                }
                for ( k = iCurrentObj; k < Vec_PtrSize(&p->vObjs); k++ )
                {
                    if ( (k & 0xFF) == 0 )
                        Extra_ProgressBarUpdate( pProgress, k, NULL );
                    pObj  = If_DsdVecObj( &p->vObjs, k );
                    nVars = If_DsdObjSuppSize(pObj);
                    //if ( nVars <= LutSize )
                    //    continue;
                    clk = Abc_Clock();
                    If_DsdManComputeTruthPtr( p, Abc_Var2Lit(k, 0), NULL, ThData[i].pTruth );
                    clkUsed += Abc_Clock() - clk;
                    ThData[i].nVars  = nVars;
                    ThData[i].Id     =  k;
                    ThData[i].Result = -1;
                    ThData[i].Status =  1;
                    //printf( "Scheduling %d for Thread %d\n", ThData[i].Id, i );
                    iCurrentObj = k+1;
                    break;
                }
            }
            fRunning = 0;
            for ( i = 0; i < nProcs; i++ )
                if ( ThData[i].Status == 1 || (ThData[i].Status == 0 && ThData[i].Id >= 0) )
                    fRunning = 1;
            //printf( "fRunning %d\n", fRunning );
        }
        // stop the threads
        for ( i = 0; i < nProcs; i++ )
        {
            assert( ThData[i].Status == 0 );
            ThData[i].Id = -1;
            ThData[i].Status = 1;
            ABC_FREE( ThData[i].pNtk );
        }
        if ( fVerbose )
        {
            printf( "Main     : " );
            Abc_PrintTime( 1, "Time", clkUsed );
            for ( i = 0; i < nProcs; i++ )
            {
                printf( "Thread %d : ", i );
                Abc_PrintTime( 1, "Time", ThData[i].clkUsed );
            }
        }
    }

    p->nObjsPrev = 0;
    p->LutSize = 0;
    Extra_ProgressBarStop( pProgress );
    printf( "Finished matching %d functions. ", Vec_PtrSize(&p->vObjs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        If_DsdManPrintDistrib( p );
}